

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
::nosize_transfer_element
          (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::PrimitivePortSymbol_*>,_96UL,_16UL>_>
           *this,basic_string_view<char,_std::char_traits<char>_> *p,ulong hash,arrays_type *arrays_
          ,long *num_destroyed)

{
  pair<std::basic_string_view<char,_std::char_traits<char>_>_&&,_slang::ast::PrimitivePortSymbol_*&&>
  local_28;
  locator local_18;
  
  *num_destroyed = *num_destroyed + 1;
  local_28.second = (PrimitivePortSymbol **)(p + 1);
  local_28.first = p;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
  ::
  nosize_unchecked_emplace_at<std::pair<std::basic_string_view<char,std::char_traits<char>>&&,slang::ast::PrimitivePortSymbol*&&>>
            (&local_18,
             (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::PrimitivePortSymbol*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,slang::detail::hashing::StackAllocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::PrimitivePortSymbol*>,96ul,16ul>>
              *)this,arrays_,hash >> ((byte)arrays_->groups_size_index & 0x3f),hash,&local_28);
  return;
}

Assistant:

void nosize_transfer_element(element_type* p, std::size_t hash, const arrays_type& arrays_,
                                 std::size_t& num_destroyed, std::true_type /* ->move */) {
        /* Destroy p even if an an exception is thrown in the middle of move
         * construction, which could leave the source half-moved.
         */
        ++num_destroyed;
        destroy_element_on_exit d{this, p};
        (void)d;
        nosize_unchecked_emplace_at(arrays_, position_for(hash, arrays_), hash,
                                    type_policy::move(*p));
    }